

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O2

char * u_austrcpy_63(char *s1,UChar *ucs2)

{
  int32_t iVar1;
  UConverter *cnv;
  char *pcVar2;
  UErrorCode err;
  
  err = U_ZERO_ERROR;
  cnv = u_getDefaultConverter_63(&err);
  pcVar2 = s1;
  if (cnv != (UConverter *)0x0 && err < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = ucnv_fromUChars_63(cnv,s1,0xfffffff,ucs2,-1,&err);
    u_releaseDefaultConverter_63(cnv);
    pcVar2 = s1 + iVar1;
  }
  *pcVar2 = '\0';
  return s1;
}

Assistant:

U_CAPI char*  U_EXPORT2
u_austrcpy(char *s1,
         const UChar *ucs2 )
{
  UErrorCode err = U_ZERO_ERROR;
  UConverter *cnv = u_getDefaultConverter(&err);
  if(U_SUCCESS(err) && cnv != NULL) {
    int32_t len = ucnv_fromUChars(cnv,
                  s1,
                  MAX_STRLEN,
                  ucs2,
                  -1,
                  &err);
    u_releaseDefaultConverter(cnv);
    s1[len] = 0;
  } else {
    *s1 = 0;
  }
  return s1;
}